

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestMultipleExtensionRanges::~TestMultipleExtensionRanges
          (TestMultipleExtensionRanges *this)

{
  TestMultipleExtensionRanges *this_local;
  
  ~TestMultipleExtensionRanges(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TestMultipleExtensionRanges::~TestMultipleExtensionRanges() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestMultipleExtensionRanges)
  SharedDtor(*this);
}